

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O3

int th06_compile(thecl_t *ecl,FILE *out)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  undefined1 uVar4;
  ushort uVar5;
  undefined2 uVar6;
  int iVar7;
  uint32_t uVar8;
  int32_t iVar9;
  long lVar10;
  undefined4 *buffer;
  size_t sVar11;
  char *out_00;
  char *in;
  ssize_t sVar12;
  list_node_t *plVar13;
  undefined2 *buffer_00;
  uint uVar14;
  uchar uVar15;
  size_t __nmemb;
  ulong uVar16;
  long lVar17;
  uint32_t *data;
  undefined8 *puVar18;
  uchar *data_00;
  long *plVar19;
  ulong uVar20;
  thecl_sub_t *ptVar21;
  bool bVar22;
  char timeline_sentinel_th6 [4];
  uint32_t magic;
  char timeline_sentinel_th8 [8];
  th06_instr_t sentinel;
  undefined2 local_b8;
  ushort local_b6;
  uint local_b4;
  void *local_b0;
  FILE *local_a8;
  list_node_t *local_a0;
  thecl_sub_t *local_98;
  undefined4 local_90;
  int local_8c;
  value_t local_88;
  list_t *local_70;
  ulong local_68;
  void *local_60;
  long local_58;
  list_node_t *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  uVar14 = ecl->version;
  local_8c = (uVar14 == 9 | 8) << 8;
  uVar16 = ecl->sub_count;
  local_b8 = (undefined2)uVar16;
  local_40 = 0xcffffffffffff;
  local_38 = 0xffff00;
  local_b6 = 0xffff;
  plVar13 = (list_node_t *)&ecl->timelines;
  do {
    plVar13 = plVar13->next;
    local_b6 = local_b6 + 1;
  } while (plVar13 != (list_node_t *)0x0);
  if (uVar14 == 6) {
    local_b6 = 0;
    uVar20 = 3;
  }
  else {
    uVar20 = 0x10;
    if (uVar14 == 9) {
      uVar20 = (ulong)local_b6;
    }
  }
  local_a8 = out;
  iVar7 = file_seekable(out);
  if (iVar7 == 0) {
    th06_compile_cold_1();
    iVar7 = 0;
  }
  else {
    __nmemb = (uVar16 & 0xffff) + uVar20;
    local_68 = (ulong)(uint)((int)__nmemb * 4);
    local_70 = &ecl->timelines;
    file_seek(out,(ulong)(7 < uVar14) * 4 + 4 + local_68);
    local_b0 = calloc(__nmemb,4);
    local_b4 = 0xffff;
    if (ecl->version == 6) {
      local_b4 = 0x87;
    }
    plVar13 = (ecl->subs).head;
    if (plVar13 != (list_node_t *)0x0) {
      local_60 = (void *)((long)local_b0 + uVar20 * 4);
      lVar17 = 0;
      do {
        ptVar21 = (thecl_sub_t *)plVar13->data;
        local_50 = plVar13;
        lVar10 = file_tell(out);
        *(int *)((long)local_60 + lVar17 * 4) = (int)lVar10;
        local_98 = ptVar21;
        local_58 = lVar17;
        for (plVar13 = (ptVar21->instrs).head; plVar13 != (list_node_t *)0x0;
            plVar13 = plVar13->next) {
          pvVar2 = plVar13->data;
          iVar7 = *(int *)((long)pvVar2 + 0x34);
          uVar16 = (ulong)iVar7;
          buffer = (undefined4 *)malloc(uVar16);
          *buffer = *(undefined4 *)((long)pvVar2 + 0x38);
          *(undefined2 *)(buffer + 1) = *(undefined2 *)((long)pvVar2 + 0x10);
          *(short *)((long)buffer + 6) = (short)iVar7;
          if (*(int *)((long)pvVar2 + 0x3c) == 0xff) {
            *(undefined2 *)(buffer + 2) = 0xff00;
            uVar14 = ecl->version;
LAB_001174d2:
            uVar6 = 0xff;
            if (uVar14 != 6) goto LAB_001174db;
          }
          else {
            uVar5 = (ushort)(*(int *)((long)pvVar2 + 0x3c) << 8);
            *(ushort *)(buffer + 2) = uVar5;
            uVar14 = ecl->version;
            if ((uVar14 & 0xfffffffe) == 6) {
              *(ushort *)(buffer + 2) = uVar5 & 0xf00;
              goto LAB_001174d2;
            }
LAB_001174db:
            uVar6 = 0;
          }
          *(undefined2 *)((long)buffer + 10) = uVar6;
          plVar19 = *(long **)((long)pvVar2 + 0x20);
          if (plVar19 != (long *)0x0) {
            data = buffer + 3;
            iVar7 = 0;
            local_a0 = plVar13;
            do {
              piVar3 = (int *)plVar19[2];
              if (piVar3[8] != 0) {
                *(ushort *)((long)buffer + 10) =
                     *(ushort *)((long)buffer + 10) | (ushort)(1 << ((byte)iVar7 & 0x1f));
              }
              iVar1 = *piVar3;
              if (iVar1 == 0x4e) {
                uVar8 = th06_find_sub(ecl,*(char **)(piVar3 + 4));
LAB_00117560:
                *data = uVar8;
                data = data + 1;
              }
              else {
                if (iVar1 == 0x6f) {
                  iVar9 = label_offset(local_98,*(char **)(piVar3 + 4));
                  uVar8 = iVar9 - *(int *)((long)pvVar2 + 0x40);
                  goto LAB_00117560;
                }
                if (iVar1 == 0x6e) {
                  uVar8 = th06_find_sub(ecl,*(char **)(piVar3 + 4));
                  *(short *)data = (short)uVar8;
                  data = (uint32_t *)((long)data + 2);
                }
                else if (piVar3[2] == 0x7a) {
                  in = *(char **)(piVar3 + 4);
                  if (g_ecl_encode_cp932 == true) {
                    sVar11 = utf8_to_cp932_len(in);
                    out_00 = (char *)malloc(sVar11 + 1);
                    in = utf8_to_cp932(out_00,in);
                  }
                  uVar14 = ecl->version;
                  if ((int)uVar14 < 8) {
                    if (uVar14 == 6) {
                      data[4] = 0;
                      data[5] = 0;
                      data[6] = 0;
                      data[7] = 0;
                      data[0] = 0;
                      data[1] = 0;
                      data[2] = 0;
                      data[3] = 0;
                      *(undefined2 *)(data + 8) = 0;
                      strncpy((char *)data,in,0x22);
                      data = (uint32_t *)((long)data + 0x22);
                    }
                    else if (uVar14 == 7) {
LAB_00117615:
                      data[8] = 0;
                      data[9] = 0;
                      data[10] = 0;
                      data[0xb] = 0;
                      data[4] = 0;
                      data[5] = 0;
                      data[6] = 0;
                      data[7] = 0;
                      data[0] = 0;
                      data[1] = 0;
                      data[2] = 0;
                      data[3] = 0;
                      strncpy((char *)data,in,0x30);
                      uVar15 = 0xaa;
LAB_00117641:
                      util_xor((uchar *)data,0x30,uVar15,'\0','\0');
                      data = data + 0xc;
                    }
                  }
                  else if (uVar14 == 8) {
                    if (iVar7 - 5U < 2) {
                      data[0xc] = 0;
                      data[0xd] = 0;
                      data[0xe] = 0;
                      data[0xf] = 0;
                      data[8] = 0;
                      data[9] = 0;
                      data[10] = 0;
                      data[0xb] = 0;
                      data[4] = 0;
                      data[5] = 0;
                      data[6] = 0;
                      data[7] = 0;
                      data[0] = 0;
                      data[1] = 0;
                      data[2] = 0;
                      data[3] = 0;
                      strncpy((char *)data,in,0x40);
                      uVar15 = 0xee;
                      if (iVar7 == 5) {
                        uVar15 = 0xdd;
                      }
                      util_xor((uchar *)data,0x40,uVar15,'\0','\0');
                      data = data + 0x10;
                    }
                    else if (iVar7 - 3U < 2) {
                      data[8] = 0;
                      data[9] = 0;
                      data[10] = 0;
                      data[0xb] = 0;
                      data[4] = 0;
                      data[5] = 0;
                      data[6] = 0;
                      data[7] = 0;
                      data[0] = 0;
                      data[1] = 0;
                      data[2] = 0;
                      data[3] = 0;
                      strncpy((char *)data,in,0x30);
                      uVar15 = 0xbb;
                      if (iVar7 == 3) {
                        uVar15 = 0xaa;
                      }
                      goto LAB_00117641;
                    }
                  }
                  else if (uVar14 == 0x5f) goto LAB_00117615;
                  if (g_ecl_encode_cp932 == true) {
                    free(in);
                  }
                }
                else {
                  local_88.val.m.data = (uchar *)*(undefined8 *)(piVar3 + 6);
                  local_88.val.d = (double)*(undefined8 *)(piVar3 + 4);
                  local_88._4_4_ = SUB84((ulong)*(undefined8 *)(piVar3 + 2) >> 0x20,0);
                  local_88.type = *piVar3;
                  sVar12 = value_to_data(&local_88,(uchar *)data,
                                         (long)buffer +
                                         ((long)*(int *)((long)pvVar2 + 0x34) - (long)data));
                  data = (uint32_t *)((long)data + sVar12);
                }
              }
              plVar19 = (long *)*plVar19;
              iVar7 = iVar7 + 1;
            } while (plVar19 != (long *)0x0);
            uVar16 = (ulong)*(ushort *)((long)buffer + 6);
            plVar13 = local_a0;
            out = local_a8;
          }
          file_write(out,buffer,uVar16 & 0xffff);
          if (local_b4 < *(ushort *)(buffer + 1)) {
            fprintf(_stderr,"%s: warning: opcode: id %hu was higher than the maximum %hu\n",argv0);
          }
          free(buffer);
        }
        file_write(out,&local_40,0xc);
        lVar17 = local_58 + 1;
        plVar13 = local_50->next;
      } while (plVar13 != (list_node_t *)0x0);
    }
    local_90 = 0x4ffff;
    local_48 = 0xffffffff;
    plVar13 = local_70->head;
    ptVar21 = (thecl_sub_t *)0x0;
    if (plVar13 != (list_node_t *)0x0) {
      do {
        pvVar2 = plVar13->data;
        local_a0 = plVar13;
        lVar17 = file_tell(out);
        *(int *)((long)local_b0 + (long)ptVar21 * 4) = (int)lVar17;
        local_98 = ptVar21;
        for (puVar18 = *(undefined8 **)((long)pvVar2 + 0x38); out = local_a8,
            puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)*puVar18) {
          lVar17 = puVar18[2];
          iVar7 = *(int *)(lVar17 + 0x34);
          uVar16 = (ulong)iVar7;
          buffer_00 = (undefined2 *)malloc(uVar16);
          *buffer_00 = *(undefined2 *)(lVar17 + 0x38);
          buffer_00[2] = *(undefined2 *)(lVar17 + 0x10);
          *(char *)(buffer_00 + 3) = (char)iVar7;
          if (ecl->version < 8) {
            uVar4 = 0;
          }
          else {
            uVar4 = *(undefined1 *)(lVar17 + 0x3c);
          }
          *(undefined1 *)((long)buffer_00 + 7) = uVar4;
          plVar19 = *(long **)(lVar17 + 0x20);
          if (plVar19 != (long *)0x0) {
            data_00 = (uchar *)(buffer_00 + 4);
            bVar22 = false;
            do {
              piVar3 = (int *)plVar19[2];
              if (bVar22) {
                local_88.val.m.data = (uchar *)*(undefined8 *)(piVar3 + 6);
                local_88.val.d = (double)*(undefined8 *)(piVar3 + 4);
                local_88._4_4_ = SUB84((ulong)*(undefined8 *)(piVar3 + 2) >> 0x20,0);
                local_88.type = *piVar3;
                sVar12 = value_to_data(&local_88,data_00,
                                       (long)buffer_00 +
                                       ((long)*(int *)(lVar17 + 0x34) - (long)data_00));
                data_00 = data_00 + sVar12;
              }
              else if (*piVar3 == 0x6e) {
                uVar8 = th06_find_sub(ecl,*(char **)(piVar3 + 4));
                buffer_00[1] = (short)uVar8;
              }
              else {
                buffer_00[1] = (short)piVar3[4];
              }
              plVar19 = (long *)*plVar19;
              bVar22 = true;
            } while (plVar19 != (long *)0x0);
            uVar16 = (ulong)*(byte *)(buffer_00 + 3);
          }
          file_write(local_a8,buffer_00,uVar16 & 0xff);
          free(buffer_00);
        }
        ptVar21 = (thecl_sub_t *)((long)&local_98->name + 1);
        bVar22 = 7 < ecl->version;
        puVar18 = &local_48;
        if (!bVar22) {
          puVar18 = (undefined8 *)&local_90;
        }
        file_write(local_a8,puVar18,(ulong)bVar22 * 4 + 4);
        plVar13 = local_a0->next;
      } while (plVar13 != (list_node_t *)0x0);
    }
    if ((ecl->version != 6) && (ecl->version != 9)) {
      lVar17 = file_tell(out);
      *(int *)((long)local_b0 + (long)ptVar21 * 4) = (int)lVar17;
    }
    file_seek(out,0);
    if (7 < ecl->version) {
      file_write(out,&local_8c,4);
    }
    file_write(out,&local_b8,4);
    pvVar2 = local_b0;
    file_write(out,local_b0,local_68);
    free(pvVar2);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int
th06_compile(
    const thecl_t* ecl,
    FILE* out)
{
    const uint32_t magic = ecl->version == 9 ? 0x00000900 : 0x00000800;
    const size_t header_size = sizeof(th06_header_t) + ((ecl->version >= 8) ? sizeof(uint32_t) : 0);

    th06_header_t header = {
        .sub_count = ecl->sub_count
    };
    uint32_t* offsets;
    const th06_instr_t sentinel = {
        .time = 0xffffffff,
        .id = 0xffff,
        .size = sizeof(sentinel),
        .rank_mask = 0xff00,
        .param_mask = 0x00ff
    };

    thecl_timeline_t* iter_timeline;
    list_for_each(&ecl->timelines, iter_timeline)
        ++header.timeline_count;

    size_t timeline_count;
    if (ecl->version == 9)
        timeline_count = header.timeline_count;
    else if (ecl->version == 6) {
        timeline_count = 3;
        header.timeline_count = 0;
    } else
        timeline_count = 16;
    const size_t offset_count = timeline_count + header.sub_count;

    if (!file_seekable(out)) {
        fprintf(stderr, "%s: output is not seekable\n", argv0);
        return 0;
    }

    file_seek(out, header_size + offset_count * sizeof(uint32_t));

    offsets = calloc(offset_count, sizeof(*offsets));

    thecl_sub_t* sub;
    uint16_t max_opcode;
    /* TODO: Get max opcodes for the rest of the games */
    switch (ecl->version)
    {
    case 6:
        max_opcode = 135;
        break;
    default:
        max_opcode = 0xFFFFU;
        break;
    }
    size_t s = 0;
    list_for_each(&ecl->subs, sub) {
        offsets[timeline_count + s] = file_tell(out);

        thecl_instr_t* instr;
        list_for_each(&sub->instrs, instr) {
            th06_instr_t* raw_instr = th06_instr_serialize(ecl, sub, instr);
            file_write(out, raw_instr, raw_instr->size);
            if (raw_instr->id > max_opcode) {
                fprintf(stderr, "%s: warning: opcode: id %hu was higher than the maximum %hu\n", argv0, raw_instr->id, max_opcode);
            }
            free(raw_instr);
        }

        file_write(out, &sentinel, sizeof(sentinel));

        ++s;
    }

    char timeline_sentinel_th6[4] = {0xff, 0xff, 0x04, 0x00};
    char timeline_sentinel_th8[8] = {0xff, 0xff, 0xff, 0xff, 0x00, 0x00, 0x00, 0x00};

    size_t o = 0;
    thecl_sub_t* timeline;
    list_for_each(&ecl->timelines, timeline) {
        offsets[o++] = file_tell(out);

        thecl_instr_t* instr;
        list_for_each(&timeline->instrs, instr) {
            th06_timeline_instr_t* raw_instr = th06_timeline_instr_serialize(ecl, instr);

            file_write(out, raw_instr, raw_instr->size);
            free(raw_instr);
        }

        file_write(out, ecl->version < 8 ? timeline_sentinel_th6 : timeline_sentinel_th8, ecl->version < 8 ? 4 : 8);
    }

    if (ecl->version != 9 && ecl->version != 6)
        offsets[o] = file_tell(out);

    file_seek(out, 0);
    if (ecl->version >= 8)
        file_write(out, &magic, sizeof(magic));
    file_write(out, &header, sizeof(header));
    file_write(out, offsets, offset_count * sizeof(*offsets));
    free(offsets);

    return 1;
}